

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::ContainsUntypedPointer(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  uint id_00;
  Instruction *this_00;
  ulong uVar5;
  size_t index;
  ulong index_00;
  bool bVar6;
  
  do {
    this_00 = FindDef(this,id);
    if (this_00 == (Instruction *)0x0) {
      return false;
    }
    iVar3 = spvOpcodeGeneratesType((uint)(this_00->inst_).opcode);
    if (iVar3 == 0) {
      return false;
    }
    uVar1 = (this_00->inst_).opcode;
    uVar5 = (ulong)uVar1;
    if (uVar5 < 0x22) {
      if ((0x3b800000UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_006b3401;
      if (uVar5 != 0x20) {
        if ((0x240000000U >> (uVar5 & 0x3f) & 1) != 0) {
          bVar6 = (ulong)((long)(this_00->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x11;
          bVar2 = !bVar6;
          if (bVar6) {
            return bVar2;
          }
          uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,1);
          bVar6 = ContainsUntypedPointer(this,uVar4);
          if (bVar6) {
            return bVar2;
          }
          uVar4 = 2;
          do {
            index_00 = (ulong)uVar4;
            uVar5 = (long)(this_00->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar5 <= index_00) {
              return index_00 < uVar5;
            }
            id_00 = Instruction::GetOperandAs<unsigned_int>(this_00,index_00);
            bVar2 = ContainsUntypedPointer(this,id_00);
            uVar4 = uVar4 + 1;
          } while (!bVar2);
          return index_00 < uVar5;
        }
        goto LAB_006b3433;
      }
      bVar2 = IsForwardPointer(this,id);
      if (bVar2) {
        return false;
      }
      index = 2;
    }
    else {
LAB_006b3433:
      if (uVar1 != 0x14ee) {
        if (uVar1 != 0x1141) {
          return false;
        }
        return true;
      }
LAB_006b3401:
      index = 1;
    }
    id = Instruction::GetOperandAs<unsigned_int>(this_00,index);
  } while( true );
}

Assistant:

bool ValidationState_t::ContainsUntypedPointer(uint32_t id) const {
  const auto inst = FindDef(id);
  if (!inst) return false;
  if (!spvOpcodeGeneratesType(inst->opcode())) return false;
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(1u));
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(2u));
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct: {
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(i)))
          return true;
      }
      return false;
    }
    default:
      return false;
  }

  return false;
}